

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib655.c
# Opt level: O0

int resolver_alloc_cb_fail(void *resolver_state,void *reserved,void *userdata)

{
  int iVar1;
  void *userdata_local;
  void *reserved_local;
  void *resolver_state_local;
  
  cb_count = cb_count + 1;
  iVar1 = strcmp((char *)userdata,TEST_DATA_STRING);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"Invalid test data received");
    exit(1);
  }
  return 1;
}

Assistant:

static int
resolver_alloc_cb_fail(void *resolver_state, void *reserved, void *userdata)
{
  (void)resolver_state;
  (void)reserved;

  cb_count++;
  if(strcmp(userdata, TEST_DATA_STRING)) {
    fprintf(stderr, "Invalid test data received");
    exit(1);
  }

  return 1;
}